

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestOneof_Test::TestBody
          (DescriptorPoolTypeResolverTest_TestOneof_Test *this)

{
  bool bVar1;
  pointer pTVar2;
  char *pcVar3;
  char *pcVar4;
  char *in_R9;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  int in_stack_fffffffffffffbc8;
  string local_418;
  AssertHelper local_3f8;
  Message local_3f0;
  string_view local_3e8;
  string_view local_3d8;
  bool local_3c1;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_390;
  Message local_388;
  string_view local_380;
  string_view local_370;
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_328;
  Message local_320;
  string_view local_318;
  string_view local_308;
  bool local_2f1;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_2c0;
  Message local_2b8;
  string_view local_2b0;
  string_view local_2a0;
  bool local_289;
  undefined1 local_288 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_258;
  Message local_250;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  bool local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_200;
  Message local_1f8;
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1a8;
  Message local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  bool local_181;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_150;
  Message local_148;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__1;
  string local_110;
  AssertHelper local_f0;
  Message local_e8 [3];
  string local_d0 [32];
  Status local_b0;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  Type type;
  DescriptorPoolTypeResolverTest_TestOneof_Test *this_local;
  
  Type::Type((Type *)&gtest_ar_.message_);
  pTVar2 = std::
           unique_ptr<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ::operator->(&(this->super_DescriptorPoolTypeResolverTest).resolver_);
  GetTypeUrl<proto2_unittest::TestAllTypes>();
  (*pTVar2->_vptr_TypeResolver[2])(&local_b0,pTVar2,local_d0,&gtest_ar_.message_);
  local_a1 = absl::lts_20250127::Status::ok(&local_b0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  absl::lts_20250127::Status::~Status(&local_b0);
  std::__cxx11::string::~string(local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(local_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)local_a0,
               (AssertionResult *)
               "resolver_ ->ResolveMessageType( GetTypeUrl<proto2_unittest::TestAllTypes>(), &type) .ok()"
               ,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x130,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    testing::Message::~Message(local_e8);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_140,"oneof_uint32");
    name._M_str = (char *)0x6f;
    name._M_len = (size_t)local_140._M_str;
    pcVar3 = (char *)0x6f;
    local_129 = HasField((anon_unknown_0 *)&gtest_ar_.message_,(Type *)0x1,0xd,
                         (Kind)local_140._M_len,name,in_stack_fffffffffffffbc8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_128,&local_129,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
    if (!bVar1) {
      testing::Message::Message(&local_148);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_128,
                 (AssertionResult *)
                 "HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_UINT32, \"oneof_uint32\", 111)"
                 ,"false","true",pcVar3);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_150,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x132,pcVar3);
      testing::internal::AssertHelper::operator=(&local_150,&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_150);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_148);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_198,"oneof_nested_message");
    name_00._M_str = (char *)0x70;
    name_00._M_len = (size_t)local_198._M_str;
    pcVar3 = (char *)0x70;
    local_181 = HasField((anon_unknown_0 *)&gtest_ar_.message_,(Type *)0x1,0xb,
                         (Kind)local_198._M_len,name_00,in_stack_fffffffffffffbc8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_180,&local_181,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_1a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__3.message_,(internal *)local_180,
                 (AssertionResult *)
                 "HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_MESSAGE, \"oneof_nested_message\", 112)"
                 ,"false","true",pcVar3);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x134,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
      testing::Message::~Message(&local_1a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1f0,"oneof_string");
    name_01._M_str = (char *)0x71;
    name_01._M_len = (size_t)local_1f0._M_str;
    pcVar3 = (char *)0x71;
    local_1d9 = HasField((anon_unknown_0 *)&gtest_ar_.message_,(Type *)0x1,9,(Kind)local_1f0._M_len,
                         name_01,in_stack_fffffffffffffbc8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_1d8,&local_1d9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
    if (!bVar1) {
      testing::Message::Message(&local_1f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__4.message_,(internal *)local_1d8,
                 (AssertionResult *)
                 "HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_STRING, \"oneof_string\", 113)"
                 ,"false","true",pcVar3);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_200,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x136,pcVar3);
      testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
      testing::internal::AssertHelper::~AssertHelper(&local_200);
      std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
      testing::Message::~Message(&local_1f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_248,"oneof_bytes");
    name_02._M_str = (char *)0x72;
    name_02._M_len = (size_t)local_248._M_str;
    pcVar3 = (char *)0x72;
    local_231 = HasField((anon_unknown_0 *)&gtest_ar_.message_,(Type *)0x1,0xc,
                         (Kind)local_248._M_len,name_02,in_stack_fffffffffffffbc8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_230,&local_231,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
    if (!bVar1) {
      testing::Message::Message(&local_250);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__5.message_,(internal *)local_230,
                 (AssertionResult *)
                 "HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_BYTES, \"oneof_bytes\", 114)"
                 ,"false","true",pcVar3);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x138,pcVar4);
      testing::internal::AssertHelper::operator=(&local_258,&local_250);
      testing::internal::AssertHelper::~AssertHelper(&local_258);
      std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
      testing::Message::~Message(&local_250);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2a0,"oneof_uint32");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2b0,"oneof_field");
    local_289 = FieldInOneof((Type *)&gtest_ar_.message_,local_2a0,local_2b0);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_288,&local_289,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
    if (!bVar1) {
      testing::Message::Message(&local_2b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__6.message_,(internal *)local_288,
                 (AssertionResult *)"FieldInOneof(type, \"oneof_uint32\", \"oneof_field\")","false",
                 "true",pcVar3);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x139,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
      testing::internal::AssertHelper::~AssertHelper(&local_2c0);
      std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
      testing::Message::~Message(&local_2b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_308,"oneof_nested_message");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_318,"oneof_field");
    local_2f1 = FieldInOneof((Type *)&gtest_ar_.message_,local_308,local_318);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_2f0,&local_2f1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
    if (!bVar1) {
      testing::Message::Message(&local_320);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__7.message_,(internal *)local_2f0,
                 (AssertionResult *)"FieldInOneof(type, \"oneof_nested_message\", \"oneof_field\")",
                 "false","true",pcVar3);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_328,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x13a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_328,&local_320);
      testing::internal::AssertHelper::~AssertHelper(&local_328);
      std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
      testing::Message::~Message(&local_320);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_370,"oneof_string");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_380,"oneof_field");
    local_359 = FieldInOneof((Type *)&gtest_ar_.message_,local_370,local_380);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_358,&local_359,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
    if (!bVar1) {
      testing::Message::Message(&local_388);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__8.message_,(internal *)local_358,
                 (AssertionResult *)"FieldInOneof(type, \"oneof_string\", \"oneof_field\")","false",
                 "true",pcVar3);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_390,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x13b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_390,&local_388);
      testing::internal::AssertHelper::~AssertHelper(&local_390);
      std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
      testing::Message::~Message(&local_388);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_3d8,"oneof_bytes");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_3e8,"oneof_field");
    local_3c1 = FieldInOneof((Type *)&gtest_ar_.message_,local_3d8,local_3e8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_3c0,&local_3c1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
    if (!bVar1) {
      testing::Message::Message(&local_3f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_418,(internal *)local_3c0,
                 (AssertionResult *)"FieldInOneof(type, \"oneof_bytes\", \"oneof_field\")","false",
                 "true",pcVar3);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x13c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
      testing::internal::AssertHelper::~AssertHelper(&local_3f8);
      std::__cxx11::string::~string((string *)&local_418);
      testing::Message::~Message(&local_3f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  Type::~Type((Type *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestOneof) {
  Type type;
  ASSERT_TRUE(resolver_
                  ->ResolveMessageType(
                      GetTypeUrl<proto2_unittest::TestAllTypes>(), &type)
                  .ok());
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_UINT32,
                       "oneof_uint32", 111));
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_MESSAGE,
                       "oneof_nested_message", 112));
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_STRING,
                       "oneof_string", 113));
  EXPECT_TRUE(HasField(type, Field::CARDINALITY_OPTIONAL, Field::TYPE_BYTES,
                       "oneof_bytes", 114));
  EXPECT_TRUE(FieldInOneof(type, "oneof_uint32", "oneof_field"));
  EXPECT_TRUE(FieldInOneof(type, "oneof_nested_message", "oneof_field"));
  EXPECT_TRUE(FieldInOneof(type, "oneof_string", "oneof_field"));
  EXPECT_TRUE(FieldInOneof(type, "oneof_bytes", "oneof_field"));
}